

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O1

void __thiscall sjtu::UserManager::login(UserManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  UserManager *pUVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  string *psVar6;
  long lVar7;
  int iVar8;
  pair<long,_bool> pVar9;
  string usname;
  string uspass;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  UserManager *local_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  long local_48;
  char local_40;
  ulong local_38;
  
  local_b0 = &local_a0;
  iVar8 = 0;
  local_a8 = 0;
  local_a0 = 0;
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  local_70 = this;
  if (0 < argc) {
    do {
      iVar2 = std::__cxx11::string::compare((char *)argv);
      psVar6 = (string *)&local_b0;
      if (iVar2 == 0) {
LAB_001059ef:
        std::__cxx11::string::_M_assign(psVar6);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)argv);
        psVar6 = (string *)&local_90;
        if (iVar2 == 0) goto LAB_001059ef;
      }
      argv = argv + 2;
      iVar8 = iVar8 + 2;
    } while (iVar8 < argc);
  }
  pUVar1 = local_70;
  this_00 = local_70->UserBpTree;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_b0,local_b0 + local_a8);
  if (local_60 == 0) {
    local_38 = 0;
  }
  else {
    lVar7 = 0;
    lVar4 = 0;
    local_38 = 0;
    do {
      uVar5 = (ulong)((int)*(char *)((long)local_68 + lVar7) + 0x100);
      lVar4 = (long)(lVar4 * 0x239 + uVar5) % 0x3b800001;
      local_38 = (long)(local_38 * 0x301 + uVar5) % 0x3b9aca07;
      lVar7 = lVar7 + 1;
    } while (local_60 != lVar7);
    local_38 = lVar4 << 0x20 | local_38;
  }
  pVar9 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_38);
  local_48 = pVar9.first;
  local_40 = pVar9.second;
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_40 == '\x01') {
    iVar8 = (*(pUVar1->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (pUVar1->UserFile,&local_48);
    iVar2 = std::__cxx11::string::compare((char *)&local_90);
    if ((iVar2 == 0) && (*(uint *)(CONCAT44(extraout_var,iVar8) + 0x6c) != pUVar1->online_flag)) {
      *(uint *)(CONCAT44(extraout_var,iVar8) + 0x6c) = pUVar1->online_flag;
      (*(pUVar1->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])();
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    }
    else {
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    }
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void login(int argc, std::string *argv) {
            std::string usname, uspass;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") usname = argv[i + 1];
                else if (argv[i] == "-p") uspass = argv[i + 1];
            }
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(usname));
            if (tmp.second == true) {
                userType *user = UserFile->read(tmp.first);
                if (uspass == user->password && user->is_online != online_flag) {
                    user->is_online = online_flag;
                    UserFile->save(user->offset);
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;
        }